

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDPValueIteration.cpp
# Opt level: O0

void __thiscall
MDPValueIteration::
Plan<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>>
          (MDPValueIteration *this,
          vector<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
          *T)

{
  size_t sVar1;
  bool bVar2;
  PlanningUnitDecPOMDPDiscrete *this_00;
  reference pdVar3;
  size_type sVar4;
  double *pdVar5;
  const_reference pdVar6;
  reference pvVar7;
  vector<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  *in_RSI;
  int __x;
  MDPSolver *in_RDI;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  Index jasucI_1;
  const_iterator2 ci_1;
  const_iterator1 ri_1;
  Index jaI_2;
  QTable oldQtable;
  double maxDelta;
  Index jasucI;
  const_iterator2 ci;
  const_iterator1 ri;
  Index jaI_1;
  size_t t;
  Index jaI;
  Index sI_1;
  QTable immReward;
  double maxQsuc;
  double R_f;
  double R_i;
  double gamma;
  Index ssucI;
  Index sI;
  size_t nrJA;
  size_t nrS;
  size_t horizon;
  QTable *in_stack_fffffffffffffcb8;
  PlanningUnitDecPOMDPDiscrete *in_stack_fffffffffffffcc0;
  QTable *in_stack_fffffffffffffcd0;
  container_type *in_stack_fffffffffffffcd8;
  QTable *in_stack_fffffffffffffce0;
  const_iterator1 *in_stack_fffffffffffffce8;
  allocator<char> *in_stack_fffffffffffffcf0;
  reference in_stack_fffffffffffffcf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd00;
  undefined1 local_211 [33];
  QTable *local_1f0;
  uint local_1e4;
  const_iterator2 local_1d0 [3];
  uint local_1a0;
  allocator<char> local_199;
  string local_198 [80];
  double local_148;
  allocator<char> local_139;
  string local_138 [36];
  uint local_114;
  const_iterator2 local_100;
  undefined4 local_ec;
  uint local_c8;
  allocator<char> local_c1;
  string local_c0 [32];
  size_t local_a0;
  uint local_88;
  uint local_84;
  double local_50;
  ulong local_48;
  double local_40;
  double local_38;
  undefined4 local_30;
  undefined4 local_2c;
  size_t local_28;
  size_t local_20;
  size_t local_18;
  
  this_00 = MDPSolver::GetPU(in_RDI);
  local_18 = PlanningUnit::GetHorizon((PlanningUnit *)this_00);
  MDPSolver::GetPU(in_RDI);
  local_20 = PlanningUnitMADPDiscrete::GetNrStates
                       (&in_stack_fffffffffffffcc0->super_PlanningUnitMADPDiscrete);
  MDPSolver::GetPU(in_RDI);
  local_28 = PlanningUnitMADPDiscrete::GetNrJointActions((PlanningUnitMADPDiscrete *)0x8737b6);
  MDPSolver::GetPU(in_RDI);
  local_38 = PlanningUnitDecPOMDPDiscrete::GetDiscount((PlanningUnitDecPOMDPDiscrete *)0x8737d3);
  QTable::QTable(in_stack_fffffffffffffce0,(size_t)in_stack_fffffffffffffcd8,
                 (size_t)in_stack_fffffffffffffcd0);
  for (local_84 = 0; local_84 < local_20; local_84 = local_84 + 1) {
    for (local_88 = 0; local_88 < local_28; local_88 = local_88 + 1) {
      MDPSolver::GetPU(in_RDI);
      dVar8 = PlanningUnitDecPOMDPDiscrete::GetReward
                        (in_stack_fffffffffffffcc0,(Index)((ulong)in_stack_fffffffffffffcb8 >> 0x20)
                         ,(Index)in_stack_fffffffffffffcb8);
      pdVar3 = boost::numeric::ublas::
               matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
               ::operator()((matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                             *)in_stack_fffffffffffffcc0,(size_type)in_stack_fffffffffffffcb8,
                            0x873895);
      *pdVar3 = dVar8;
    }
  }
  sVar1 = local_18;
  if (((ulong)in_RDI[3]._m_pu & 0x100) == 0) {
    local_148 = 1.79769313486232e+308;
    QTable::QTable(in_stack_fffffffffffffcd0);
    while (0.0001 < local_148) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffd00,(char *)in_stack_fffffffffffffcf8,
                 in_stack_fffffffffffffcf0);
      TimedAlgorithm::StartTimer
                ((TimedAlgorithm *)in_stack_fffffffffffffcc0,(string *)in_stack_fffffffffffffcb8);
      std::__cxx11::string::~string(local_198);
      std::allocator<char>::~allocator(&local_199);
      local_148 = 0.0;
      std::vector<QTable,_std::allocator<QTable>_>::operator[]
                ((vector<QTable,_std::allocator<QTable>_> *)(in_RDI + 2),0);
      QTable::operator=((QTable *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
      for (local_1a0 = 0; local_1a0 < local_28; local_1a0 = local_1a0 + 1) {
        std::
        vector<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
        ::operator[](in_RSI,(ulong)local_1a0);
        boost::numeric::ublas::
        matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
        ::begin1((matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                  *)in_stack_fffffffffffffcb8);
        while( true ) {
          std::
          vector<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
          ::operator[](in_RSI,(ulong)local_1a0);
          boost::numeric::ublas::
          matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
          ::end1((matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                  *)in_stack_fffffffffffffcb8);
          bVar2 = boost::numeric::ublas::
                  random_access_iterator_base<boost::numeric::ublas::dense_random_access_iterator_tag,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>::const_iterator1,_double,_long>
                  ::operator!=((random_access_iterator_base<boost::numeric::ublas::dense_random_access_iterator_tag,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>::const_iterator1,_double,_long>
                                *)in_stack_fffffffffffffcc0,
                               (derived_iterator_type *)in_stack_fffffffffffffcb8);
          boost::numeric::ublas::
          matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
          ::const_iterator1::~const_iterator1((const_iterator1 *)0x8740c6);
          if (!bVar2) break;
          sVar4 = boost::numeric::ublas::
                  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                  ::const_iterator1::index1((const_iterator1 *)in_stack_fffffffffffffd00);
          local_2c = (undefined4)sVar4;
          pdVar3 = boost::numeric::ublas::
                   matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                   ::operator()((matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                                 *)in_stack_fffffffffffffcc0,(size_type)in_stack_fffffffffffffcb8,
                                0x8741d2);
          local_40 = *pdVar3;
          local_48 = 0;
          boost::numeric::ublas::
          matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
          ::const_iterator1::begin((const_iterator1 *)in_stack_fffffffffffffcd8);
          while( true ) {
            boost::numeric::ublas::
            matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
            ::const_iterator1::end(in_stack_fffffffffffffce8);
            bVar2 = boost::numeric::ublas::
                    random_access_iterator_base<boost::numeric::ublas::dense_random_access_iterator_tag,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>::const_iterator2,_double,_long>
                    ::operator!=((random_access_iterator_base<boost::numeric::ublas::dense_random_access_iterator_tag,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>::const_iterator2,_double,_long>
                                  *)in_stack_fffffffffffffcc0,
                                 (derived_iterator_type *)in_stack_fffffffffffffcb8);
            boost::numeric::ublas::
            matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
            ::const_iterator2::~const_iterator2((const_iterator2 *)0x87424f);
            if (!bVar2) break;
            sVar4 = boost::numeric::ublas::
                    matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                    ::const_iterator2::index2((const_iterator2 *)in_stack_fffffffffffffd00);
            local_30 = (undefined4)sVar4;
            local_50 = -1.79769313486232e+308;
            for (local_1e4 = 0; local_1e4 < local_28; local_1e4 = local_1e4 + 1) {
              pdVar3 = boost::numeric::ublas::
                       matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                       ::operator()((matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                                     *)in_stack_fffffffffffffcc0,
                                    (size_type)in_stack_fffffffffffffcb8,0x87431f);
              pdVar5 = std::max<double>(pdVar3,&local_50);
              local_50 = *pdVar5;
            }
            in_stack_fffffffffffffd00 =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 boost::numeric::ublas::
                 matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                 ::const_iterator2::operator*(local_1d0);
            auVar15._8_8_ = 0;
            auVar15._0_8_ = *(double *)in_stack_fffffffffffffd00;
            auVar11._8_8_ = 0;
            auVar11._0_8_ = local_50;
            auVar19._8_8_ = 0;
            auVar19._0_8_ = local_48;
            auVar12 = vfmadd213sd_fma(auVar11,auVar15,auVar19);
            local_48 = auVar12._0_8_;
            boost::numeric::ublas::
            matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
            ::const_iterator2::operator++((const_iterator2 *)in_stack_fffffffffffffcd0);
          }
          local_ec = 0x1f;
          boost::numeric::ublas::
          matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
          ::const_iterator2::~const_iterator2((const_iterator2 *)0x87426f);
          auVar20._8_8_ = 0;
          auVar20._0_8_ = local_40;
          auVar16._8_8_ = 0;
          auVar16._0_8_ = local_38;
          auVar12._8_8_ = 0;
          auVar12._0_8_ = local_48;
          auVar12 = vfmadd213sd_fma(auVar12,auVar16,auVar20);
          in_stack_fffffffffffffcf0 = auVar12._0_8_;
          std::vector<QTable,_std::allocator<QTable>_>::operator[]
                    ((vector<QTable,_std::allocator<QTable>_> *)(in_RDI + 2),0);
          in_stack_fffffffffffffcf8 =
               boost::numeric::ublas::
               matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
               ::operator()((matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                             *)in_stack_fffffffffffffcc0,(size_type)in_stack_fffffffffffffcb8,
                            0x874420);
          *in_stack_fffffffffffffcf8 = (double)in_stack_fffffffffffffcf0;
          in_stack_fffffffffffffce8 =
               (const_iterator1 *)
               boost::numeric::ublas::
               matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
               ::operator()((matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                             *)in_stack_fffffffffffffcc0,(size_type)in_stack_fffffffffffffcb8,
                            0x874455);
          in_stack_fffffffffffffcd8 =
               (in_stack_fffffffffffffce8->
               super_container_const_reference<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
               ).c_;
          pvVar7 = std::vector<QTable,_std::allocator<QTable>_>::operator[]
                             ((vector<QTable,_std::allocator<QTable>_> *)(in_RDI + 2),0);
          __x = (int)pvVar7 + 8;
          pdVar3 = boost::numeric::ublas::
                   matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                   ::operator()((matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                                 *)in_stack_fffffffffffffcc0,(size_type)in_stack_fffffffffffffcb8,
                                0x87449e);
          in_stack_fffffffffffffcd0 = (QTable *)((double)in_stack_fffffffffffffcd8 - *pdVar3);
          std::abs(__x);
          local_1f0 = in_stack_fffffffffffffcd0;
          pdVar5 = std::max<double>(&local_148,(double *)&local_1f0);
          local_148 = *pdVar5;
          boost::numeric::ublas::
          matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
          ::const_iterator1::operator++((const_iterator1 *)in_stack_fffffffffffffcd0);
        }
        local_ec = 0x1c;
        boost::numeric::ublas::
        matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
        ::const_iterator1::~const_iterator1((const_iterator1 *)0x8740ed);
      }
      in_stack_fffffffffffffcb8 = (QTable *)(in_RDI + 1);
      in_stack_fffffffffffffcc0 = (PlanningUnitDecPOMDPDiscrete *)local_211;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffd00,(char *)in_stack_fffffffffffffcf8,
                 in_stack_fffffffffffffcf0);
      TimedAlgorithm::StopTimer
                ((TimedAlgorithm *)in_stack_fffffffffffffcc0,(string *)in_stack_fffffffffffffcb8);
      std::__cxx11::string::~string((string *)(local_211 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_211);
    }
    QTable::~QTable((QTable *)in_stack_fffffffffffffcc0);
  }
  else {
    do {
      local_a0 = sVar1 - 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffd00,(char *)in_stack_fffffffffffffcf8,
                 in_stack_fffffffffffffcf0);
      TimedAlgorithm::StartTimer
                ((TimedAlgorithm *)in_stack_fffffffffffffcc0,(string *)in_stack_fffffffffffffcb8);
      std::__cxx11::string::~string(local_c0);
      std::allocator<char>::~allocator(&local_c1);
      for (local_c8 = 0; local_c8 < local_28; local_c8 = local_c8 + 1) {
        std::
        vector<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
        ::operator[](in_RSI,(ulong)local_c8);
        boost::numeric::ublas::
        matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
        ::begin1((matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                  *)in_stack_fffffffffffffcb8);
        while( true ) {
          std::
          vector<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
          ::operator[](in_RSI,(ulong)local_c8);
          boost::numeric::ublas::
          matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
          ::end1((matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                  *)in_stack_fffffffffffffcb8);
          bVar2 = boost::numeric::ublas::
                  random_access_iterator_base<boost::numeric::ublas::dense_random_access_iterator_tag,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>::const_iterator1,_double,_long>
                  ::operator!=((random_access_iterator_base<boost::numeric::ublas::dense_random_access_iterator_tag,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>::const_iterator1,_double,_long>
                                *)in_stack_fffffffffffffcc0,
                               (derived_iterator_type *)in_stack_fffffffffffffcb8);
          boost::numeric::ublas::
          matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
          ::const_iterator1::~const_iterator1((const_iterator1 *)0x873a41);
          if (!bVar2) break;
          sVar4 = boost::numeric::ublas::
                  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                  ::const_iterator1::index1((const_iterator1 *)in_stack_fffffffffffffd00);
          local_2c = (undefined4)sVar4;
          pdVar3 = boost::numeric::ublas::
                   matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                   ::operator()((matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                                 *)in_stack_fffffffffffffcc0,(size_type)in_stack_fffffffffffffcb8,
                                0x873b3a);
          local_40 = *pdVar3;
          local_48 = 0;
          if (local_a0 < local_18 - 1) {
            boost::numeric::ublas::
            matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
            ::const_iterator1::begin((const_iterator1 *)in_stack_fffffffffffffcd8);
            while( true ) {
              boost::numeric::ublas::
              matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
              ::const_iterator1::end(in_stack_fffffffffffffce8);
              bVar2 = boost::numeric::ublas::
                      random_access_iterator_base<boost::numeric::ublas::dense_random_access_iterator_tag,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>::const_iterator2,_double,_long>
                      ::operator!=((random_access_iterator_base<boost::numeric::ublas::dense_random_access_iterator_tag,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>::const_iterator2,_double,_long>
                                    *)in_stack_fffffffffffffcc0,
                                   (derived_iterator_type *)in_stack_fffffffffffffcb8);
              boost::numeric::ublas::
              matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
              ::const_iterator2::~const_iterator2((const_iterator2 *)0x873bde);
              if (!bVar2) break;
              sVar4 = boost::numeric::ublas::
                      matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                      ::const_iterator2::index2((const_iterator2 *)in_stack_fffffffffffffd00);
              local_30 = (undefined4)sVar4;
              local_50 = -1.79769313486232e+308;
              for (local_114 = 0; local_114 < local_28; local_114 = local_114 + 1) {
                std::vector<QTable,_std::allocator<QTable>_>::operator[]
                          ((vector<QTable,_std::allocator<QTable>_> *)(in_RDI + 2),local_a0 + 1);
                pdVar3 = boost::numeric::ublas::
                         matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                         ::operator()((matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                                       *)in_stack_fffffffffffffcc0,
                                      (size_type)in_stack_fffffffffffffcb8,0x873cd6);
                pdVar5 = std::max<double>(pdVar3,&local_50);
                local_50 = *pdVar5;
              }
              pdVar6 = boost::numeric::ublas::
                       matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                       ::const_iterator2::operator*(&local_100);
              auVar13._8_8_ = 0;
              auVar13._0_8_ = *pdVar6;
              auVar9._8_8_ = 0;
              auVar9._0_8_ = local_50;
              auVar17._8_8_ = 0;
              auVar17._0_8_ = local_48;
              auVar12 = vfmadd213sd_fma(auVar9,auVar13,auVar17);
              local_48 = auVar12._0_8_;
              boost::numeric::ublas::
              matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
              ::const_iterator2::operator++((const_iterator2 *)in_stack_fffffffffffffcd0);
            }
            local_ec = 0x11;
            boost::numeric::ublas::
            matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
            ::const_iterator2::~const_iterator2((const_iterator2 *)0x873c01);
          }
          auVar18._8_8_ = 0;
          auVar18._0_8_ = local_40;
          auVar14._8_8_ = 0;
          auVar14._0_8_ = local_38;
          auVar10._8_8_ = 0;
          auVar10._0_8_ = local_48;
          auVar12 = vfmadd213sd_fma(auVar10,auVar14,auVar18);
          std::vector<QTable,_std::allocator<QTable>_>::operator[]
                    ((vector<QTable,_std::allocator<QTable>_> *)(in_RDI + 2),local_a0);
          pdVar3 = boost::numeric::ublas::
                   matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                   ::operator()((matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                                 *)in_stack_fffffffffffffcc0,(size_type)in_stack_fffffffffffffcb8,
                                0x873df5);
          *pdVar3 = auVar12._0_8_;
          boost::numeric::ublas::
          matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
          ::const_iterator1::operator++((const_iterator1 *)in_stack_fffffffffffffcd0);
        }
        local_ec = 0xe;
        boost::numeric::ublas::
        matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
        ::const_iterator1::~const_iterator1((const_iterator1 *)0x873a68);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffd00,(char *)in_stack_fffffffffffffcf8,
                 in_stack_fffffffffffffcf0);
      TimedAlgorithm::StopTimer
                ((TimedAlgorithm *)in_stack_fffffffffffffcc0,(string *)in_stack_fffffffffffffcb8);
      std::__cxx11::string::~string(local_138);
      std::allocator<char>::~allocator(&local_139);
      sVar1 = local_a0;
    } while (local_a0 != 0);
  }
  QTable::~QTable((QTable *)in_stack_fffffffffffffcc0);
  return;
}

Assistant:

void MDPValueIteration::Plan(std::vector<const M*> T)
{
    size_t horizon = GetPU()->GetHorizon();
    size_t nrS = GetPU()->GetNrStates();
    size_t nrJA =  GetPU()->GetNrJointActions();
    
    Index sI,ssucI;
    double gamma=GetPU()->GetDiscount();
    double R_i,R_f,maxQsuc;
    
    // cache immediate reward for speed
    QTable immReward(nrS,nrJA);
    for(Index sI = 0; sI < nrS; sI++)
        for(Index jaI = 0; jaI < nrJA; jaI++)
            immReward(sI,jaI)=GetPU()->GetReward(sI, jaI);
    
    if(_m_finiteHorizon)
    {
        for(size_t t = horizon - 1; true; t--)
        {
            StartTimer("Iteration");
            for(Index jaI = 0; jaI < nrJA; jaI++)
            {
                for(typename M::const_iterator1 ri=T[jaI]->begin1();
                    ri!=T[jaI]->end1(); ++ri)
                {
                    sI=ri.index1();
                    
                    //calc. expected immediate reward
                    R_i = immReward(sI,jaI);
                    R_f = 0.0;
                    if(t < horizon - 1)
                    {
                        //calc. expected future reward
                        for (typename M::const_iterator2 ci = ri.begin();
                             ci != ri.end(); ++ci)
                        {
                            ssucI=ci.index2();
                            //find the best action at ssucI
                            maxQsuc = -DBL_MAX;
                            for(Index jasucI = 0; jasucI < nrJA; jasucI++)
                                maxQsuc = std::max( _m_QValues[t+1](ssucI,jasucI),
                                                    maxQsuc);
                            
                            R_f += *ci * maxQsuc;
                        }//done calc. expected future reward
                    }
                    _m_QValues[t](sI,jaI) = R_i + gamma*R_f;
                }//end for jaI
            }//end for sI
            StopTimer("Iteration");
            if(t == 0) //escape from (loop t is unsigned!)
                break;
        }
    }
    else // infinite horizon problem
    {
        double maxDelta=DBL_MAX;
        QTable oldQtable;
        
        while(maxDelta>1e-4)
        {
            StartTimer("Iteration");
            maxDelta=0;
            oldQtable=_m_QValues[0];
            for(Index jaI = 0; jaI < nrJA; jaI++)
            {
                for(typename M::const_iterator1 ri=T[jaI]->begin1();
                    ri!=T[jaI]->end1(); ++ri)
                {
                    sI=ri.index1();
                    
                    //calc. expected immediate reward
                    R_i = immReward(sI,jaI);
                    R_f = 0.0;
                    //calc. expected future reward
                    
                    for (typename M::const_iterator2 ci = ri.begin();
                         ci != ri.end(); ++ci)
                    {
                        ssucI=ci.index2();
                        
                        //find the best action at ssucI
                        maxQsuc = -DBL_MAX;
                        for(Index jasucI = 0; jasucI < nrJA; jasucI++)
                            maxQsuc = std::max( oldQtable(ssucI,jasucI),
                                                maxQsuc);
                            
                        R_f += *ci * maxQsuc;
                    }//done calc. expected future reward
                    
                    _m_QValues[0](sI,jaI) = R_i + gamma*R_f;
                    maxDelta=std::max(maxDelta,
                                      std::abs(oldQtable(sI,jaI)-
                                               _m_QValues[0](sI,jaI)));
                }//end for jaI
            }//end for sI
            
            StopTimer("Iteration");

#if DEBUG_MDPValueIteration
            std::cout << "delta " << maxDelta << std::endl;
            PrintTimersSummary();
#endif
        }
    }
}